

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O1

int Amap_ParseCountPins(Vec_Ptr_t *vTokens,int iPos)

{
  int iVar1;
  char *__s1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  iVar1 = vTokens->nSize;
  iVar3 = 0;
  if (iPos < iVar1) {
    uVar4 = (ulong)(uint)iPos;
    iVar3 = 0;
    do {
      if (iPos < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      __s1 = (char *)vTokens->pArray[uVar4];
      iVar2 = strcmp(__s1,"PIN");
      if (iVar2 == 0) {
        iVar3 = iVar3 + 1;
      }
      else {
        iVar2 = strcmp(__s1,"GATE");
        if (iVar2 == 0) {
          return iVar3;
        }
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < iVar1);
  }
  return iVar3;
}

Assistant:

int Amap_ParseCountPins( Vec_Ptr_t * vTokens, int iPos )
{
    char * pToken;
    int i, Counter = 0;
    Vec_PtrForEachEntryStart( char *, vTokens, pToken, i, iPos )
        if ( !strcmp( pToken, AMAP_STRING_PIN ) )
            Counter++;
        else if ( !strcmp( pToken, AMAP_STRING_GATE ) )
            return Counter;
    return Counter;
}